

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void tlbi_aa64_vmalle1_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  int iVar2;
  CPUState *src_cpu;
  int mask;
  CPUState *cs;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  src_cpu = env_cpu(env);
  iVar2 = vae1_tlbmask(env);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_by_mmuidx_all_cpus_synced_aarch64(src_cpu,(uint16_t)iVar2);
  }
  else {
    tlb_flush_by_mmuidx_aarch64(src_cpu,(uint16_t)iVar2);
  }
  return;
}

Assistant:

static void tlbi_aa64_vmalle1_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                    uint64_t value)
{
    CPUState *cs = env_cpu(env);
    int mask = vae1_tlbmask(env);

    if (tlb_force_broadcast(env)) {
        tlb_flush_by_mmuidx_all_cpus_synced(cs, mask);
    } else {
        tlb_flush_by_mmuidx(cs, mask);
    }
}